

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O1

bool __thiscall QLayout::isEmpty(QLayout *this)

{
  char cVar1;
  long *plVar2;
  int iVar3;
  bool bVar4;
  
  plVar2 = (long *)(**(code **)(*(long *)this + 0xa8))(this,0);
  bVar4 = plVar2 == (long *)0x0;
  if ((!bVar4) && (cVar1 = (**(code **)(*plVar2 + 0x40))(plVar2), cVar1 != '\0')) {
    iVar3 = 1;
    do {
      plVar2 = (long *)(**(code **)(*(long *)this + 0xa8))(this,iVar3);
      bVar4 = plVar2 == (long *)0x0;
      if (bVar4) {
        return bVar4;
      }
      cVar1 = (**(code **)(*plVar2 + 0x40))(plVar2);
      iVar3 = iVar3 + 1;
    } while (cVar1 != '\0');
  }
  return bVar4;
}

Assistant:

bool QLayout::isEmpty() const
{
    int i = 0;
    QLayoutItem *item = itemAt(i);
    while (item) {
        if (!item->isEmpty())
            return false;
        ++i;
        item = itemAt(i);
    }
    return true;
}